

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O2

void __thiscall QTuioHandler::process2DObjFseq(QTuioHandler *this,QOscMessage *message)

{
  long lVar1;
  bool bVar2;
  QWindow *win;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  undefined8 *puVar7;
  TouchPoint *pTVar8;
  QTuioToken *t;
  QTuioToken *tc;
  long in_FS_OFFSET;
  byte bVar9;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> local_c8;
  TouchPoint tp;
  
  bVar9 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  win = (QWindow *)QGuiApplication::focusWindow();
  if (win == (QWindow *)0x0) {
    QGuiApplication::topLevelWindows();
    bVar2 = forceDelivery;
    QArrayDataPointer<QWindow_*>::~QArrayDataPointer((QArrayDataPointer<QWindow_*> *)&tp);
    if ((tp.normalPosition.xp == 0.0) || ((bVar2 & 1U) == 0)) goto LAB_0010a13d;
    QGuiApplication::topLevelWindows();
    win = *(QWindow **)tp.uniqueId;
    QArrayDataPointer<QWindow_*>::~QArrayDataPointer((QArrayDataPointer<QWindow_*> *)&tp);
    if (win == (QWindow *)0x0) goto LAB_0010a13d;
  }
  local_c8.size = 0;
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (TouchPoint *)0x0;
  if (*(long *)(this + 0x48) == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = *(long *)(*(long *)(this + 0x48) + 0x30);
  }
  QList<QWindowSystemInterface::TouchPoint>::reserve
            ((QList<QWindowSystemInterface::TouchPoint> *)&local_c8,lVar4 + *(long *)(this + 0x60));
  lVar4 = *(long *)(this + 0x48);
  if (lVar4 == 0) {
    p_Var3 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var3 = *(_Rb_tree_node_base **)(lVar4 + 0x20);
  }
  p_Var6 = (_Rb_tree_node_base *)(lVar4 + 0x10);
  if (lVar4 == 0) {
    p_Var6 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var3 != p_Var6; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    puVar7 = &DAT_0010f528;
    pTVar8 = &tp;
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)pTVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      pTVar8 = (TouchPoint *)((long)pTVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    tokenToTouchPoint(&tp,this,(QTuioToken *)&p_Var3[1].field_0x4,win);
    QList<QWindowSystemInterface::TouchPoint>::
    emplaceBack<QWindowSystemInterface::TouchPoint_const&>
              ((QList<QWindowSystemInterface::TouchPoint> *)&local_c8,&tp);
    QArrayDataPointer<QPointF>::~QArrayDataPointer(&tp.rawPositions.d);
  }
  tc = *(QTuioToken **)(this + 0x58);
  for (lVar4 = *(long *)(this + 0x60) * 0x2c; lVar4 != 0; lVar4 = lVar4 + -0x2c) {
    puVar7 = &DAT_0010f528;
    pTVar8 = &tp;
    for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined8 *)pTVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      pTVar8 = (TouchPoint *)((long)pTVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    tokenToTouchPoint(&tp,this,tc,win);
    tp.state = Released;
    tp.velocity.v[0] = 0.0;
    tp.velocity.v[1] = 0.0;
    QList<QWindowSystemInterface::TouchPoint>::
    emplaceBack<QWindowSystemInterface::TouchPoint_const&>
              ((QList<QWindowSystemInterface::TouchPoint> *)&local_c8,&tp);
    QArrayDataPointer<QPointF>::~QArrayDataPointer(&tp.rawPositions.d);
    tc = tc + 1;
  }
  QWindowSystemInterface::handleTouchEvent<QWindowSystemInterface::DefaultDelivery>
            (win,*(undefined8 *)(this + 0x10),&local_c8,0);
  QList<QTuioToken>::clear((QList<QTuioToken> *)(this + 0x50));
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::~QArrayDataPointer(&local_c8);
LAB_0010a13d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTuioHandler::process2DObjFseq(const QOscMessage &message)
{
    Q_UNUSED(message); // TODO: do we need to do anything with the frame id?

    QWindow *win = QGuiApplication::focusWindow();
    if (!win && QGuiApplication::topLevelWindows().size() > 0 && forceDelivery)
          win = QGuiApplication::topLevelWindows().at(0);

    if (!win)
        return;

    QList<QWindowSystemInterface::TouchPoint> tpl;
    tpl.reserve(m_activeTokens.size() + m_deadTokens.size());

    for (const QTuioToken & t : std::as_const(m_activeTokens)) {
        QWindowSystemInterface::TouchPoint tp = tokenToTouchPoint(t, win);
        tpl.append(tp);
    }

    for (const QTuioToken & t : std::as_const(m_deadTokens)) {
        QWindowSystemInterface::TouchPoint tp = tokenToTouchPoint(t, win);
        tp.state = QEventPoint::State::Released;
        tp.velocity = QVector2D();
        tpl.append(tp);
    }
    QWindowSystemInterface::handleTouchEvent(win, m_device, tpl);

    m_deadTokens.clear();
}